

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLSourceArrayLoader.h
# Opt level: O1

Source<COLLADASaxFWL::BaseArrayElement<float>,_(COLLADASaxFWL::SourceBase::DataType)2> * __thiscall
COLLADASaxFWL::SourceArrayLoader::
beginArray<COLLADASaxFWL::Source<COLLADASaxFWL::BaseArrayElement<float>,(COLLADASaxFWL::SourceBase::DataType)2>>
          (SourceArrayLoader *this,uint64 count,ParserChar *id)

{
  int *piVar1;
  char *pcVar2;
  Source<COLLADASaxFWL::BaseArrayElement<float>,_(COLLADASaxFWL::SourceBase::DataType)2> *pSVar3;
  float *pfVar4;
  
  pSVar3 = (Source<COLLADASaxFWL::BaseArrayElement<float>,_(COLLADASaxFWL::SourceBase::DataType)2> *
           )operator_new(0xe0);
  (pSVar3->super_SourceBase).mId._M_dataplus._M_p = (pointer)&(pSVar3->super_SourceBase).mId.field_2
  ;
  (pSVar3->super_SourceBase).mId._M_string_length = 0;
  (pSVar3->super_SourceBase).mId.field_2._M_local_buf[0] = '\0';
  (pSVar3->super_SourceBase).mStride = 0;
  (pSVar3->super_SourceBase).mInitialIndex = 0;
  (pSVar3->super_SourceBase).mLoadedInputElements.mData = (Semantic *)0x0;
  (pSVar3->super_SourceBase).mLoadedInputElements.mCount = 0;
  (pSVar3->super_SourceBase).mLoadedInputElements.mCapacity = 0;
  (pSVar3->super_SourceBase).mLoadedInputElements.mFlags = 3;
  (pSVar3->super_SourceBase).mAccessor.
  super__Vector_base<COLLADASaxFWL::SourceBase::AccessorParameter,_std::allocator<COLLADASaxFWL::SourceBase::AccessorParameter>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pSVar3->super_SourceBase).mAccessor.
  super__Vector_base<COLLADASaxFWL::SourceBase::AccessorParameter,_std::allocator<COLLADASaxFWL::SourceBase::AccessorParameter>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pSVar3->super_SourceBase).mAccessor.
  super__Vector_base<COLLADASaxFWL::SourceBase::AccessorParameter,_std::allocator<COLLADASaxFWL::SourceBase::AccessorParameter>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pSVar3->super_SourceBase)._vptr_SourceBase = (_func_int **)&PTR__Source_009d32a0;
  (pSVar3->mArrayElement)._vptr_BaseArrayElement = (_func_int **)&PTR__BaseArrayElement_009d32e0;
  (pSVar3->mArrayElement).mCount = 0;
  (pSVar3->mArrayElement).mId._M_dataplus._M_p = (pointer)&(pSVar3->mArrayElement).mId.field_2;
  (pSVar3->mArrayElement).mId._M_string_length = 0;
  (pSVar3->mArrayElement).mId.field_2._M_local_buf[0] = '\0';
  (pSVar3->mArrayElement).mName._M_dataplus._M_p = (pointer)&(pSVar3->mArrayElement).mName.field_2;
  (pSVar3->mArrayElement).mName._M_string_length = 0;
  (pSVar3->mArrayElement).mName.field_2._M_local_buf[0] = '\0';
  *(undefined8 *)((long)&(pSVar3->mArrayElement).mValuesArray.mCount + 4) = 0;
  *(undefined8 *)((long)&(pSVar3->mArrayElement).mValuesArray.mCapacity + 4) = 0;
  (pSVar3->mArrayElement).mValuesArray.mData = (float *)0x0;
  (pSVar3->mArrayElement).mValuesArray.mCount = 0;
  if (count == 0) {
    (pSVar3->mArrayElement).mValuesArray.mData = (float *)0x0;
    (pSVar3->mArrayElement).mValuesArray.mCount = 0;
    (pSVar3->mArrayElement).mValuesArray.mCapacity = 0;
  }
  else {
    pfVar4 = (float *)malloc(count * 4);
    (pSVar3->mArrayElement).mValuesArray.mData = pfVar4;
    (pSVar3->mArrayElement).mValuesArray.mCount = 0;
    (pSVar3->mArrayElement).mValuesArray.mCapacity = count;
  }
  piVar1 = &(pSVar3->mArrayElement).mValuesArray.mFlags;
  *(byte *)piVar1 = (byte)*piVar1 | 1;
  std::__cxx11::string::_M_assign((string *)&(pSVar3->super_SourceBase).mId);
  this->mCurrentSoure = (SourceBase *)pSVar3;
  if (id != (ParserChar *)0x0) {
    pcVar2 = (char *)(this->mCurrentArrayId)._M_string_length;
    strlen(id);
    std::__cxx11::string::_M_replace((ulong)&this->mCurrentArrayId,0,pcVar2,(ulong)id);
  }
  return pSVar3;
}

Assistant:

SourceType* SourceArrayLoader::beginArray( uint64 count,  const ParserChar* id )
	{
		SourceType* newSource = new SourceType();
		newSource->getArrayElement().getValues().allocMemory((size_t)count);
		newSource->setId(mCurrentSourceId);
		mCurrentSoure = newSource;
		if ( id )
			mCurrentArrayId = id;
		return newSource;
	}